

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaIf.c
# Opt level: O0

int Gia_ManFromIfLogicNode
              (void *pIfMan,Gia_Man_t *pNew,int iObj,Vec_Int_t *vLeaves,Vec_Int_t *vLeavesTemp,
              word *pRes,char *pStr,Vec_Int_t *vCover,Vec_Int_t *vMapping,Vec_Int_t *vMapping2,
              Vec_Int_t *vPacking,int fCheck75,int fCheck44e)

{
  byte bVar1;
  word *pwVar2;
  Gia_Man_t *pGVar3;
  int iVar4;
  int iVar5;
  Gia_Obj_t *pGVar6;
  size_t sVar7;
  word wVar8;
  int local_158;
  int local_14c;
  int local_128;
  int local_124;
  int k;
  int i_1;
  int nWordsMax;
  int nVarsMax;
  char pLut2 [32];
  char pLut1 [32];
  char pLut0 [32];
  word local_b0;
  word Func2;
  word Func1;
  word Func0;
  word z;
  word t;
  Vec_Int_t *vLeaves2;
  int local_78;
  int iObjLit3;
  int iObjLit2;
  int iObjLit1;
  int nLutRoot;
  int nLutLeaf2;
  int nLutLeaf;
  int Length;
  int i;
  int nLeaves;
  word *pRes_local;
  Vec_Int_t *vLeavesTemp_local;
  Vec_Int_t *vLeaves_local;
  Gia_Man_t *pGStack_38;
  int iObj_local;
  Gia_Man_t *pNew_local;
  void *pIfMan_local;
  
  _i = pRes;
  pRes_local = (word *)vLeavesTemp;
  vLeavesTemp_local = vLeaves;
  vLeaves_local._4_4_ = iObj;
  pGStack_38 = pNew;
  pNew_local = (Gia_Man_t *)pIfMan;
  Length = Vec_IntSize(vLeaves);
  if (fCheck75 != 0) {
    pStr = "54";
  }
  if (fCheck44e == 0) {
    if ((*(int *)(pNew_local->pSpec + 0x44) == 0) ||
       (iVar4 = Vec_IntSize(vLeavesTemp_local), iVar4 != 6)) {
      if (pStr == (char *)0x0) {
        pIfMan_local._4_4_ =
             Gia_ManFromIfLogicCreateLut(pGStack_38,_i,vLeavesTemp_local,vCover,vMapping,vMapping2);
      }
      else {
        sVar7 = strlen(pStr);
        iVar4 = Length;
        nLutLeaf2 = (int)sVar7;
        if ((nLutLeaf2 == 2) || (nLutLeaf2 == 3)) {
          for (nLutLeaf = 0; nLutLeaf < nLutLeaf2; nLutLeaf = nLutLeaf + 1) {
            if ((pStr[nLutLeaf] + -0x30 < 3) || (6 < pStr[nLutLeaf] + -0x30)) {
              printf("The LUT size (%d) should belong to {3,4,5,6}.\n",
                     (ulong)((int)pStr[nLutLeaf] - 0x30));
              return -1;
            }
          }
          nLutRoot = *pStr + -0x30;
          if (nLutLeaf2 == 3) {
            local_14c = pStr[1] + -0x30;
          }
          else {
            local_14c = 0;
          }
          iObjLit1 = local_14c;
          iObjLit2 = pStr[nLutLeaf2 + -1] + -0x30;
          if (local_14c == 0) {
            local_158 = 0;
          }
          else {
            local_158 = local_14c + -1;
          }
          if (*pStr + -0x31 + local_158 + iObjLit2 < Length) {
            printf("The node size (%d) is too large for the LUT structure %s.\n",(ulong)(uint)Length
                   ,pStr);
            pIfMan_local._4_4_ = -1;
          }
          else {
            iVar5 = Abc_MaxInt(nLutRoot,iObjLit2);
            iVar5 = Abc_MaxInt(local_14c,iVar5);
            if (iVar5 < iVar4) {
              memset(&nWordsMax,0,0x20);
              if (Gia_ManFromIfLogicNode::TruthStore[0][0] == 0) {
                for (local_124 = 0; local_124 < 0x10; local_124 = local_124 + 1) {
                  Gia_ManFromIfLogicNode::pTruths[local_124] =
                       Gia_ManFromIfLogicNode::TruthStore[local_124];
                }
                for (local_124 = 0; local_124 < 6; local_124 = local_124 + 1) {
                  for (local_128 = 0; local_128 < 0x400; local_128 = local_128 + 1) {
                    Gia_ManFromIfLogicNode::pTruths[local_124][local_128] =
                         Gia_ManFromIfLogicNode::Truth6[local_124];
                  }
                }
                for (local_124 = 6; local_124 < 0x10; local_124 = local_124 + 1) {
                  for (local_128 = 0; local_128 < 0x400; local_128 = local_128 + 1) {
                    bVar1 = (char)local_124 - 6U & 0x1f;
                    wVar8 = (word)(uint)(0 >> bVar1);
                    if ((local_128 >> bVar1 & 1U) != 0) {
                      wVar8 = 0xffffffffffffffff;
                    }
                    Gia_ManFromIfLogicNode::pTruths[local_124][local_128] = wVar8;
                  }
                }
              }
              iVar4 = Kit_TruthIsConst0((uint *)_i,Length);
              if ((iVar4 == 0) && (iVar4 = Kit_TruthIsConst1((uint *)_i,Length), iVar4 == 0)) {
                for (nLutLeaf = 0; nLutLeaf < Length; nLutLeaf = nLutLeaf + 1) {
                  iVar4 = Kit_TruthIsEqual((uint *)_i,
                                           (uint *)Gia_ManFromIfLogicNode::pTruths[nLutLeaf],Length)
                  ;
                  if (iVar4 != 0) {
                    iVar4 = Vec_IntEntry(vLeavesTemp_local,nLutLeaf);
                    return iVar4;
                  }
                  iVar4 = Kit_TruthIsOpposite((uint *)_i,
                                              (uint *)Gia_ManFromIfLogicNode::pTruths[nLutLeaf],
                                              Length);
                  if (iVar4 != 0) {
                    iVar4 = Vec_IntEntry(vLeavesTemp_local,nLutLeaf);
                    iVar4 = Abc_LitNot(iVar4);
                    return iVar4;
                  }
                }
                if (fCheck75 == 0) {
                  if (nLutLeaf2 == 2) {
                    iVar4 = If_CluCheckExt((void *)0x0,_i,Length,nLutRoot,iObjLit2,pLut1 + 0x18,
                                           pLut2 + 0x18,&Func1,&Func2);
                    if (iVar4 == 0) {
                      Extra_PrintHex(_stdout,(uint *)_i,Length);
                      printf("    ");
                      Kit_DsdPrintFromTruth((uint *)_i,Length);
                      printf("\n");
                      printf("Node %d is not decomposable. Deriving LUT structures has failed.\n",
                             (ulong)vLeaves_local._4_4_);
                      return -1;
                    }
                  }
                  else {
                    iVar4 = If_CluCheckExt3(pNew_local,_i,Length,nLutRoot,iObjLit1,iObjLit2,
                                            pLut1 + 0x18,pLut2 + 0x18,(char *)&nWordsMax,&Func1,
                                            &Func2,&local_b0);
                    if (iVar4 == 0) {
                      Extra_PrintHex(_stdout,(uint *)_i,Length);
                      printf("    ");
                      Kit_DsdPrintFromTruth((uint *)_i,Length);
                      printf("\n");
                      printf("Node %d is not decomposable. Deriving LUT structures has failed.\n",
                             (ulong)vLeaves_local._4_4_);
                      return -1;
                    }
                  }
                }
                else if ((Length < 8) &&
                        (iVar4 = If_CluCheckExt((void *)0x0,_i,Length,4,4,pLut1 + 0x18,pLut2 + 0x18,
                                                &Func1,&Func2), iVar4 != 0)) {
                  nLutRoot = 4;
                  iObjLit2 = 4;
                }
                else {
                  iVar4 = If_CluCheckExt((void *)0x0,_i,Length,5,4,pLut1 + 0x18,pLut2 + 0x18,&Func1,
                                         &Func2);
                  if (iVar4 == 0) {
                    iVar4 = If_CluCheckExt((void *)0x0,_i,Length,4,5,pLut1 + 0x18,pLut2 + 0x18,
                                           &Func1,&Func2);
                    if (iVar4 == 0) {
                      Extra_PrintHex(_stdout,(uint *)_i,Length);
                      printf("    ");
                      Kit_DsdPrintFromTruth((uint *)_i,Length);
                      printf("\n");
                      printf("Node %d is not decomposable. Deriving LUT structures has failed.\n",
                             (ulong)vLeaves_local._4_4_);
                      return -1;
                    }
                    nLutRoot = 4;
                    iObjLit2 = 5;
                  }
                  else {
                    nLutRoot = 5;
                    iObjLit2 = 4;
                  }
                }
                Vec_IntClear((Vec_Int_t *)pRes_local);
                for (nLutLeaf = 0; pwVar2 = pRes_local, nLutLeaf < pLut2[0x18];
                    nLutLeaf = nLutLeaf + 1) {
                  iVar4 = Vec_IntEntry(vLeavesTemp_local,(int)pLut2[(long)(nLutLeaf + 2) + 0x18]);
                  Vec_IntPush((Vec_Int_t *)pwVar2,iVar4);
                }
                iObjLit3 = Gia_ManFromIfLogicCreateLut
                                     (pGStack_38,&Func2,(Vec_Int_t *)pRes_local,vCover,vMapping,
                                      vMapping2);
                if ((nLutLeaf2 == 3) && ('\0' < (char)nWordsMax)) {
                  Vec_IntClear((Vec_Int_t *)pRes_local);
                  for (nLutLeaf = 0; pwVar2 = pRes_local, nLutLeaf < (char)nWordsMax;
                      nLutLeaf = nLutLeaf + 1) {
                    if (*(char *)((long)&nWordsMax + (long)(nLutLeaf + 2)) == Length) {
                      Vec_IntPush((Vec_Int_t *)pRes_local,iObjLit3);
                    }
                    else {
                      iVar4 = Vec_IntEntry(vLeavesTemp_local,
                                           (int)*(char *)((long)&nWordsMax + (long)(nLutLeaf + 2)));
                      Vec_IntPush((Vec_Int_t *)pwVar2,iVar4);
                    }
                  }
                  local_78 = Gia_ManFromIfLogicCreateLut
                                       (pGStack_38,&local_b0,(Vec_Int_t *)pRes_local,vCover,vMapping
                                        ,vMapping2);
                  Vec_IntPush(vPacking,3);
                  iVar4 = Abc_Lit2Var(iObjLit3);
                  Vec_IntPush(vPacking,iVar4);
                  iVar4 = Abc_Lit2Var(local_78);
                  Vec_IntPush(vPacking,iVar4);
                }
                else {
                  Vec_IntPush(vPacking,2);
                  iVar4 = Abc_Lit2Var(iObjLit3);
                  Vec_IntPush(vPacking,iVar4);
                  local_78 = -1;
                }
                Vec_IntClear((Vec_Int_t *)pRes_local);
                for (nLutLeaf = 0; pwVar2 = pRes_local, nLutLeaf < pLut1[0x18];
                    nLutLeaf = nLutLeaf + 1) {
                  if (pLut1[(long)(nLutLeaf + 2) + 0x18] == Length) {
                    Vec_IntPush((Vec_Int_t *)pRes_local,iObjLit3);
                  }
                  else if ((int)pLut1[(long)(nLutLeaf + 2) + 0x18] == Length + 1) {
                    Vec_IntPush((Vec_Int_t *)pRes_local,local_78);
                  }
                  else {
                    iVar4 = Vec_IntEntry(vLeavesTemp_local,(int)pLut1[(long)(nLutLeaf + 2) + 0x18]);
                    Vec_IntPush((Vec_Int_t *)pwVar2,iVar4);
                  }
                }
                vLeaves2._4_4_ =
                     Gia_ManFromIfLogicCreateLut
                               (pGStack_38,&Func1,(Vec_Int_t *)pRes_local,vCover,vMapping,vMapping2)
                ;
                iVar4 = Abc_Lit2Var(vLeaves2._4_4_);
                Vec_IntPush(vPacking,iVar4);
                Vec_IntAddToEntry(vPacking,0,1);
                pIfMan_local._4_4_ = vLeaves2._4_4_;
              }
              else {
                iVar4 = Kit_TruthIsConst1((uint *)_i,Length);
                iObjLit3 = Abc_LitNotCond(0,iVar4);
                iVar4 = Vec_IntEntry(vMapping,0);
                if (iVar4 == 0) {
                  iVar4 = Vec_IntSize(vMapping2);
                  Vec_IntSetEntry(vMapping,0,iVar4);
                  Vec_IntPush(vMapping2,0);
                  Vec_IntPush(vMapping2,0);
                }
                pIfMan_local._4_4_ = iObjLit3;
              }
            }
            else {
              iObjLit3 = Gia_ManFromIfLogicCreateLut
                                   (pGStack_38,_i,vLeavesTemp_local,vCover,vMapping,vMapping2);
              pGVar3 = pGStack_38;
              iVar4 = Abc_Lit2Var(iObjLit3);
              pGVar6 = Gia_ManObj(pGVar3,iVar4);
              iVar4 = Gia_ObjIsCi(pGVar6);
              if ((iVar4 == 0) && (1 < iObjLit3)) {
                Vec_IntPush(vPacking,1);
                iVar4 = Abc_Lit2Var(iObjLit3);
                Vec_IntPush(vPacking,iVar4);
                Vec_IntAddToEntry(vPacking,0,1);
              }
              pIfMan_local._4_4_ = iObjLit3;
            }
          }
        }
        else {
          printf("Wrong LUT struct (%s)\n",pStr);
          pIfMan_local._4_4_ = -1;
        }
      }
    }
    else {
      t = (word)Vec_IntAlloc(4);
      z = *_i;
      Func0 = If_Dec6Perform(z,1);
      If_Dec6Verify(z,Func0);
      z = Abc_Tt6Stretch(Func0 & 0xffff,4);
      Vec_IntClear((Vec_Int_t *)t);
      for (nLutLeaf = 0; wVar8 = t, nLutLeaf < 4; nLutLeaf = nLutLeaf + 1) {
        iVar4 = Vec_IntEntry(vLeavesTemp_local,
                             (uint)(Func0 >> ((char)(nLutLeaf << 2) + 0x10U & 0x3f)) & 7);
        Vec_IntPush((Vec_Int_t *)wVar8,iVar4);
      }
      iObjLit3 = Gia_ManFromIfLogicCreateLut(pGStack_38,&z,(Vec_Int_t *)t,vCover,vMapping,vMapping2)
      ;
      z = Abc_Tt6Stretch(Func0 >> 0x20 & 0xffff,4);
      Vec_IntClear((Vec_Int_t *)t);
      for (nLutLeaf = 0; wVar8 = t, nLutLeaf < 4; nLutLeaf = nLutLeaf + 1) {
        if ((Func0 >> ((char)(nLutLeaf << 2) + 0x30U & 0x3f) & 7) == 7) {
          Vec_IntPush((Vec_Int_t *)t,iObjLit3);
        }
        else {
          iVar4 = Vec_IntEntry(vLeavesTemp_local,
                               (uint)(Func0 >> ((char)(nLutLeaf << 2) + 0x30U & 0x3f)) & 7);
          Vec_IntPush((Vec_Int_t *)wVar8,iVar4);
        }
      }
      iObjLit3 = Gia_ManFromIfLogicCreateLut(pGStack_38,&z,(Vec_Int_t *)t,vCover,vMapping,vMapping2)
      ;
      Vec_IntFree((Vec_Int_t *)t);
      pIfMan_local._4_4_ = iObjLit3;
    }
  }
  else {
    iVar4 = Vec_IntSize(vLeavesTemp_local);
    if (iVar4 < 5) {
      iObjLit3 = Gia_ManFromIfLogicCreateLut
                           (pGStack_38,_i,vLeavesTemp_local,vCover,vMapping,vMapping2);
      pGVar3 = pGStack_38;
      iVar4 = Abc_Lit2Var(iObjLit3);
      pGVar6 = Gia_ManObj(pGVar3,iVar4);
      iVar4 = Gia_ObjIsCi(pGVar6);
      if ((iVar4 == 0) && (1 < iObjLit3)) {
        Vec_IntPush(vPacking,1);
        iVar4 = Abc_Lit2Var(iObjLit3);
        Vec_IntPush(vPacking,iVar4);
        Vec_IntAddToEntry(vPacking,0,1);
      }
      pIfMan_local._4_4_ = iObjLit3;
    }
    else {
      pIfMan_local._4_4_ =
           Gia_ManFromIfLogicCreateLutSpecial
                     (pGStack_38,_i,vLeavesTemp_local,(Vec_Int_t *)pRes_local,vCover,vMapping,
                      vMapping2,vPacking);
    }
  }
  return pIfMan_local._4_4_;
}

Assistant:

int Gia_ManFromIfLogicNode( void * pIfMan, Gia_Man_t * pNew, int iObj, Vec_Int_t * vLeaves, Vec_Int_t * vLeavesTemp, 
    word * pRes, char * pStr, Vec_Int_t * vCover, Vec_Int_t * vMapping, Vec_Int_t * vMapping2, Vec_Int_t * vPacking, int fCheck75, int fCheck44e )
{
    int nLeaves = Vec_IntSize(vLeaves);
    int i, Length, nLutLeaf, nLutLeaf2, nLutRoot, iObjLit1, iObjLit2, iObjLit3;
    // workaround for the special case
    if ( fCheck75 )
        pStr = "54";
    // perform special case matching for 44
    if ( fCheck44e )
    {
        if ( Vec_IntSize(vLeaves) <= 4 )
        {
            // create mapping
            iObjLit1 = Gia_ManFromIfLogicCreateLut( pNew, pRes, vLeaves, vCover, vMapping, vMapping2 );
            // write packing
            if ( !Gia_ObjIsCi(Gia_ManObj(pNew, Abc_Lit2Var(iObjLit1))) && iObjLit1 > 1 )
            {
                Vec_IntPush( vPacking, 1 );
                Vec_IntPush( vPacking, Abc_Lit2Var(iObjLit1) );
                Vec_IntAddToEntry( vPacking, 0, 1 );
            }
            return iObjLit1;
        }
        return Gia_ManFromIfLogicCreateLutSpecial( pNew, pRes, vLeaves, vLeavesTemp, vCover, vMapping, vMapping2, vPacking );
    }
    if ( ((If_Man_t *)pIfMan)->pPars->fLut6Filter && Vec_IntSize(vLeaves) == 6 )
    {
        extern word If_Dec6Perform( word t, int fDerive );
        extern void If_Dec6Verify( word t, word z );
        Vec_Int_t * vLeaves2 = Vec_IntAlloc( 4 );
        word t = pRes[0];
        word z = If_Dec6Perform( t, 1 );
        //If_DecPrintConfig( z );
        If_Dec6Verify( t, z );

        t = Abc_Tt6Stretch( z & 0xffff, 4 );
        Vec_IntClear( vLeaves2 );
        for ( i = 0; i < 4; i++ )
            Vec_IntPush( vLeaves2, Vec_IntEntry( vLeaves, (int)((z >> (16+i*4)) & 7) ) );
        iObjLit1 = Gia_ManFromIfLogicCreateLut( pNew, &t, vLeaves2, vCover, vMapping, vMapping2 );

        t = Abc_Tt6Stretch( (z >> 32) & 0xffff, 4 );
        Vec_IntClear( vLeaves2 );
        for ( i = 0; i < 4; i++ )
            if ( ((z >> (48+i*4)) & 7) == 7 )
                Vec_IntPush( vLeaves2, iObjLit1 );
            else
                Vec_IntPush( vLeaves2, Vec_IntEntry( vLeaves, (int)((z >> (48+i*4)) & 7) ) );
        iObjLit1 = Gia_ManFromIfLogicCreateLut( pNew, &t, vLeaves2, vCover, vMapping, vMapping2 );

        Vec_IntFree( vLeaves2 );
        return iObjLit1;
    }
    // check if there is no LUT structures
    if ( pStr == NULL )
        return Gia_ManFromIfLogicCreateLut( pNew, pRes, vLeaves, vCover, vMapping, vMapping2 );
    // quit if parameters are wrong
    Length = strlen(pStr);
    if ( Length != 2 && Length != 3 )
    {
        printf( "Wrong LUT struct (%s)\n", pStr );
        return -1;
    }
    for ( i = 0; i < Length; i++ )
        if ( pStr[i] - '0' < 3 || pStr[i] - '0' > 6 )
        {
            printf( "The LUT size (%d) should belong to {3,4,5,6}.\n", pStr[i] - '0' );
            return -1;
        }

    nLutLeaf  =                   pStr[0] - '0';
    nLutLeaf2 = ( Length == 3 ) ? pStr[1] - '0' : 0;
    nLutRoot  =                   pStr[Length-1] - '0';
    if ( nLeaves > nLutLeaf - 1 + (nLutLeaf2 ? nLutLeaf2 - 1 : 0) + nLutRoot )
    {
        printf( "The node size (%d) is too large for the LUT structure %s.\n", nLeaves, pStr );
        return -1;
    }

    // consider easy case
    if ( nLeaves <= Abc_MaxInt( nLutLeaf2, Abc_MaxInt(nLutLeaf, nLutRoot) ) )
    {
        // create mapping
        iObjLit1 = Gia_ManFromIfLogicCreateLut( pNew, pRes, vLeaves, vCover, vMapping, vMapping2 );
        // write packing
        if ( !Gia_ObjIsCi(Gia_ManObj(pNew, Abc_Lit2Var(iObjLit1))) && iObjLit1 > 1 )
        {
            Vec_IntPush( vPacking, 1 );
            Vec_IntPush( vPacking, Abc_Lit2Var(iObjLit1) );
            Vec_IntAddToEntry( vPacking, 0, 1 );
        }
        return iObjLit1;
    }
    else
    {
        extern int If_CluMinimumBase( word * t, int * pSupp, int nVarsAll, int * pnVars );

        static word TruthStore[16][1<<10] = {{0}}, * pTruths[16];
        word Func0, Func1, Func2;
        char pLut0[32], pLut1[32], pLut2[32] = {0};

        if ( TruthStore[0][0] == 0 )
        {
            static word Truth6[6] = {
                0xAAAAAAAAAAAAAAAA,
                0xCCCCCCCCCCCCCCCC,
                0xF0F0F0F0F0F0F0F0,
                0xFF00FF00FF00FF00,
                0xFFFF0000FFFF0000,
                0xFFFFFFFF00000000
            };
            int nVarsMax = 16;
            int nWordsMax = (1 << 10);
            int i, k;
            assert( nVarsMax <= 16 );
            for ( i = 0; i < nVarsMax; i++ )
                pTruths[i] = TruthStore[i];
            for ( i = 0; i < 6; i++ )
                for ( k = 0; k < nWordsMax; k++ )
                    pTruths[i][k] = Truth6[i];
            for ( i = 6; i < nVarsMax; i++ )
                for ( k = 0; k < nWordsMax; k++ )
                    pTruths[i][k] = ((k >> (i-6)) & 1) ? ~(word)0 : 0;
        }
        // derive truth table
        if ( Kit_TruthIsConst0((unsigned *)pRes, nLeaves) || Kit_TruthIsConst1((unsigned *)pRes, nLeaves) )
        {
//            fprintf( pFile, ".names %s\n %d\n", Abc_ObjName(Abc_ObjFanout0(pObj)), Kit_TruthIsConst1((unsigned *)pRes, nLeaves) );
            iObjLit1 = Abc_LitNotCond( 0, Kit_TruthIsConst1((unsigned *)pRes, nLeaves) );
            // write mapping
            if ( Vec_IntEntry(vMapping, 0) == 0 )
            {
                Vec_IntSetEntry( vMapping, 0, Vec_IntSize(vMapping2) );
                Vec_IntPush( vMapping2, 0 );
                Vec_IntPush( vMapping2, 0 );
            }
            return iObjLit1;
        }
        // check for elementary truth table
        for ( i = 0; i < nLeaves; i++ )
        {
            if ( Kit_TruthIsEqual((unsigned *)pRes, (unsigned *)pTruths[i], nLeaves) )
                return Vec_IntEntry(vLeaves, i);
            if ( Kit_TruthIsOpposite((unsigned *)pRes, (unsigned *)pTruths[i], nLeaves) )
                return Abc_LitNot(Vec_IntEntry(vLeaves, i));
        }

        // perform decomposition
        if ( fCheck75 ) 
        {
//            if ( nLeaves < 8 && If_CutPerformCheck16( p, (unsigned *)pTruth, nVars, nLeaves, "44" ) )
            if ( nLeaves < 8 && If_CluCheckExt( NULL, pRes, nLeaves, 4, 4, pLut0, pLut1, &Func0, &Func1 ) )
            {
                nLutLeaf = 4;
                nLutRoot = 4;
            }
//            if ( If_CutPerformCheck45( p, (unsigned *)pTruth, nVars, nLeaves, pStr ) )
            else if ( If_CluCheckExt( NULL, pRes, nLeaves, 5, 4, pLut0, pLut1, &Func0, &Func1 ) )
            {
                nLutLeaf = 5;
                nLutRoot = 4;
            }
//            if ( If_CutPerformCheck54( p, (unsigned *)pTruth, nVars, nLeaves, pStr ) )
            else if ( If_CluCheckExt( NULL, pRes, nLeaves, 4, 5, pLut0, pLut1, &Func0, &Func1 ) )
            {
                nLutLeaf = 4;
                nLutRoot = 5;
            }
            else
            {
                Extra_PrintHex( stdout, (unsigned *)pRes, nLeaves );  printf( "    " );
                Kit_DsdPrintFromTruth( (unsigned*)pRes, nLeaves );  printf( "\n" );
                printf( "Node %d is not decomposable. Deriving LUT structures has failed.\n", iObj );
                return -1;
            }
        }
        else
        {
            if ( Length == 2 )
            {
                if ( !If_CluCheckExt( NULL, pRes, nLeaves, nLutLeaf, nLutRoot, pLut0, pLut1, &Func0, &Func1 ) )
                {
                    Extra_PrintHex( stdout, (unsigned *)pRes, nLeaves );  printf( "    " );
                    Kit_DsdPrintFromTruth( (unsigned*)pRes, nLeaves );  printf( "\n" );
                    printf( "Node %d is not decomposable. Deriving LUT structures has failed.\n", iObj );
                    return -1;
                }
            }
            else
            {
                if ( !If_CluCheckExt3( pIfMan, pRes, nLeaves, nLutLeaf, nLutLeaf2, nLutRoot, pLut0, pLut1, pLut2, &Func0, &Func1, &Func2 ) )
                {
                    Extra_PrintHex( stdout, (unsigned *)pRes, nLeaves );  printf( "    " );
                    Kit_DsdPrintFromTruth( (unsigned*)pRes, nLeaves );  printf( "\n" );
                    printf( "Node %d is not decomposable. Deriving LUT structures has failed.\n", iObj );
                    return -1;
                }
            }
        }

/*
        // write leaf node
        Id = Abc2_NtkAllocObj( pNew, pLut1[0], Abc2_ObjType(pObj) );
        iObjLit1 = Abc_Var2Lit( Id, 0 );
        pObjNew = Abc2_NtkObj( pNew, Id );
        for ( i = 0; i < pLut1[0]; i++ )
            Abc2_ObjSetFaninLit( pObjNew, i, Abc2_ObjFaninCopy(pObj, pLut1[2+i]) );
        Abc2_ObjSetTruth( pObjNew, Func1 );
*/
        // write leaf node
        Vec_IntClear( vLeavesTemp );
        for ( i = 0; i < pLut1[0]; i++ )
            Vec_IntPush( vLeavesTemp, Vec_IntEntry(vLeaves, pLut1[2+i]) );
        iObjLit1 = Gia_ManFromIfLogicCreateLut( pNew, &Func1, vLeavesTemp, vCover, vMapping, vMapping2 );

        if ( Length == 3 && pLut2[0] > 0 )
        {
        /*
            Id = Abc2_NtkAllocObj( pNew, pLut2[0], Abc2_ObjType(pObj) );
            iObjLit2 = Abc_Var2Lit( Id, 0 );
            pObjNew = Abc2_NtkObj( pNew, Id );
            for ( i = 0; i < pLut2[0]; i++ )
                if ( pLut2[2+i] == nLeaves )
                    Abc2_ObjSetFaninLit( pObjNew, i, iObjLit1 );
                else
                    Abc2_ObjSetFaninLit( pObjNew, i, Abc2_ObjFaninCopy(pObj, pLut2[2+i]) );
            Abc2_ObjSetTruth( pObjNew, Func2 );
        */

            // write leaf node
            Vec_IntClear( vLeavesTemp );
            for ( i = 0; i < pLut2[0]; i++ )
                if ( pLut2[2+i] == nLeaves )
                    Vec_IntPush( vLeavesTemp, iObjLit1 );
                else
                    Vec_IntPush( vLeavesTemp, Vec_IntEntry(vLeaves, pLut2[2+i]) );
            iObjLit2 = Gia_ManFromIfLogicCreateLut( pNew, &Func2, vLeavesTemp, vCover, vMapping, vMapping2 );

            // write packing
            Vec_IntPush( vPacking, 3 );
            Vec_IntPush( vPacking, Abc_Lit2Var(iObjLit1) );
            Vec_IntPush( vPacking, Abc_Lit2Var(iObjLit2) );
        }
        else
        {
            // write packing
            Vec_IntPush( vPacking, 2 );
            Vec_IntPush( vPacking, Abc_Lit2Var(iObjLit1) );
            iObjLit2 = -1;
        }
/*
        // write root node
        Id = Abc2_NtkAllocObj( pNew, pLut0[0], Abc2_ObjType(pObj) );
        iObjLit3 = Abc_Var2Lit( Id, 0 );
        pObjNew = Abc2_NtkObj( pNew, Id );
        for ( i = 0; i < pLut0[0]; i++ )
            if ( pLut0[2+i] == nLeaves )
                Abc2_ObjSetFaninLit( pObjNew, i, iObjLit1 );
            else if ( pLut0[2+i] == nLeaves+1 )
                Abc2_ObjSetFaninLit( pObjNew, i, iObjLit2 );
            else
                Abc2_ObjSetFaninLit( pObjNew, i, Abc2_ObjFaninCopy(pObj, pLut0[2+i]) );
        Abc2_ObjSetTruth( pObjNew, Func0 );
        Abc2_ObjSetCopy( pObj, iObjLit3 );
*/
        // write root node
        Vec_IntClear( vLeavesTemp );
        for ( i = 0; i < pLut0[0]; i++ )
            if ( pLut0[2+i] == nLeaves )
                Vec_IntPush( vLeavesTemp, iObjLit1 );
            else if ( pLut0[2+i] == nLeaves+1 )
                Vec_IntPush( vLeavesTemp, iObjLit2 );
            else
                Vec_IntPush( vLeavesTemp, Vec_IntEntry(vLeaves, pLut0[2+i]) );
        iObjLit3 = Gia_ManFromIfLogicCreateLut( pNew, &Func0, vLeavesTemp, vCover, vMapping, vMapping2 );

        // write packing
        Vec_IntPush( vPacking, Abc_Lit2Var(iObjLit3) );
        Vec_IntAddToEntry( vPacking, 0, 1 );
    }
    return iObjLit3;
}